

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

PgHdr * pcacheSortDirtyList(PgHdr *pIn)

{
  PgHdr *pPVar1;
  PgHdr *local_130;
  int local_124;
  PgHdr *pPStack_120;
  int i;
  PgHdr *p;
  PgHdr *a [32];
  PgHdr *local_10;
  PgHdr *pIn_local;
  
  memset(&p,0,0x100);
  local_10 = pIn;
  do {
    if (local_10 == (PgHdr *)0x0) {
      pPStack_120 = p;
      for (local_124 = 1; local_124 < 0x20; local_124 = local_124 + 1) {
        if (a[(long)local_124 + -1] != (PgHdr *)0x0) {
          if (pPStack_120 == (PgHdr *)0x0) {
            local_130 = a[(long)local_124 + -1];
          }
          else {
            local_130 = pcacheMergeDirtyList(pPStack_120,a[(long)local_124 + -1]);
          }
          pPStack_120 = local_130;
        }
      }
      return pPStack_120;
    }
    pPStack_120 = local_10;
    pPVar1 = local_10->pDirty;
    local_10->pDirty = (PgHdr *)0x0;
    for (local_124 = 0; local_124 < 0x1f; local_124 = local_124 + 1) {
      if (a[(long)local_124 + -1] == (PgHdr *)0x0) {
        a[(long)local_124 + -1] = pPStack_120;
        break;
      }
      pPStack_120 = pcacheMergeDirtyList(a[(long)local_124 + -1],pPStack_120);
      a[(long)local_124 + -1] = (PgHdr *)0x0;
    }
    local_10 = pPVar1;
    if (local_124 == 0x1f) {
      a[0x1e] = pcacheMergeDirtyList(a[0x1e],pPStack_120);
    }
  } while( true );
}

Assistant:

static PgHdr *pcacheSortDirtyList(PgHdr *pIn){
  PgHdr *a[N_SORT_BUCKET], *p;
  int i;
  memset(a, 0, sizeof(a));
  while( pIn ){
    p = pIn;
    pIn = p->pDirty;
    p->pDirty = 0;
    for(i=0; ALWAYS(i<N_SORT_BUCKET-1); i++){
      if( a[i]==0 ){
        a[i] = p;
        break;
      }else{
        p = pcacheMergeDirtyList(a[i], p);
        a[i] = 0;
      }
    }
    if( NEVER(i==N_SORT_BUCKET-1) ){
      /* To get here, there need to be 2^(N_SORT_BUCKET) elements in
      ** the input list.  But that is impossible.
      */
      a[i] = pcacheMergeDirtyList(a[i], p);
    }
  }
  p = a[0];
  for(i=1; i<N_SORT_BUCKET; i++){
    if( a[i]==0 ) continue;
    p = p ? pcacheMergeDirtyList(p, a[i]) : a[i];
  }
  return p;
}